

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

double zernike_poly(int m,int n,double rho)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar7 = 0.0;
  if ((m <= n && -1 < (n | m)) && ((n - m & 0x80000001U) != 1)) {
    dVar6 = pow(rho,(double)m);
    dVar7 = dVar6;
    if (m == 0) {
      if ((n != 0) && (dVar7 = (rho + rho) * rho + -1.0, 3 < n)) {
        iVar2 = 0xc;
        dVar8 = 2.0;
        iVar3 = 2;
        do {
          iVar4 = iVar3 + 2;
          dVar9 = (double)(iVar3 * iVar3) / dVar8;
          dVar9 = (((double)iVar2 * rho * rho - ((double)(iVar4 * iVar4) / (double)iVar4 + dVar9)) *
                   dVar7 - dVar9 * dVar6) * ((double)iVar4 / (double)(iVar4 * iVar4));
          iVar2 = iVar2 + 8;
          dVar6 = dVar7;
          dVar7 = dVar9;
          dVar8 = dVar8 + 2.0;
          iVar3 = iVar4;
        } while (iVar4 <= n + -2);
      }
    }
    else if (m <= n + -2) {
      iVar3 = m * 4 + 4;
      iVar4 = 2;
      dVar8 = 0.0;
      iVar2 = m;
      do {
        dVar9 = dVar6;
        iVar1 = iVar2 + 2;
        iVar5 = m * 2 + iVar4 + -2;
        dVar7 = (((double)iVar3 * rho * rho -
                 ((double)(iVar4 * iVar4) / (double)iVar1 + (double)(iVar5 * iVar5) / (double)iVar2)
                 ) * dVar9 - ((double)(iVar2 * iVar2 - m * m) / (double)iVar2) * dVar8) *
                ((double)iVar1 / (double)(iVar1 * iVar1 - m * m));
        iVar3 = iVar3 + 8;
        iVar4 = iVar4 + 2;
        dVar6 = dVar7;
        dVar8 = dVar9;
        iVar2 = iVar1;
      } while (iVar1 <= n + -2);
    }
  }
  return dVar7;
}

Assistant:

BURKHARDT_EXPORT
double zernike_poly ( int m, int n, double rho )

//****************************************************************************80
//
//  Purpose:
//
//    ZERNIKE_POLY evaluates a Zernike polynomial at RHO.
//
//  Discussion:
//
//    This routine uses the facts that:
//
//    *) R^M_N = 0 if M < 0, or N < 0, or N < M.
//    *) R^M_M = RHO^M
//    *) R^M_N = 0 if mod ( N - M, 2 ) = 1.
//
//    and the recursion:
//
//    R^M_(N+2) = A * [ ( B * RHO^2 - C ) * R^M_N - D * R^M_(N-2) ]
//
//    where
//
//    A = ( N + 2 ) / ( ( N + 2 )^2 - M^2 )
//    B = 4 * ( N + 1 )
//    C = ( N + M )^2 / N + ( N - M + 2 )^2 / ( N + 2 )
//    D = ( N^2 - M^2 ) / N
//
//    I wish I could clean up the recursion in the code, but for
//    now, I have to treat the case M = 0 specially.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    11 November 2005
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Eric Weisstein,
//    CRC Concise Encyclopedia of Mathematics,
//    CRC Press, 2002,
//    Second edition,
//    ISBN: 1584883472,
//    LC: QA5.W45.
//
//  Parameters:
//
//    Input, int M, the upper index.
//
//    Input, int N, the lower index.
//
//    Input, double RHO, the radial coordinate.
//
//    Output, double ZERNIKE_POLY, the value of the Zernike
//    polynomial R^M_N at the point RHO.
//
{
  double a;
  double b;
  double c;
  double d;
  int nn;
  double z;
  double zm2;
  double zp2;
//
//  Do checks.
//
  if ( m < 0 )
  {
    z = 0.0;
    return z;
  }

  if ( n < 0 )
  {
    z = 0.0;
    return z;
  }

  if ( n < m )
  {
    z = 0.0;
    return z;
  }

  if ( ( n - m ) % 2 == 1 )
  {
    z = 0.0;
    return z;
  }

  zm2 = 0.0;
  z = pow ( rho, m );

  if ( m == 0 )
  {
    if ( n == 0 )
    {
      return z;
    }

    zm2 = z;
    z = 2.0 * rho * rho - 1.0;

    for ( nn = m+2; nn <= n-2; nn = nn + 2 )
    {
      a = double( nn + 2 ) 
        / double( ( nn + 2 ) * ( nn + 2 ) - m * m );

      b = double( 4 * ( nn + 1 ) );

      c = double( ( nn + m ) * ( nn + m ) ) / double( nn ) 
        + double( ( nn - m + 2 ) * ( nn - m + 2 ) ) 
        / double( nn + 2 );

      d = double( nn * nn - m * m ) / double( nn );

      zp2 = a * ( ( b * rho * rho - c ) * z - d * zm2 );
      zm2 = z;
      z = zp2;
    }
  }
  else
  {
    for ( nn = m; nn <= n-2; nn = nn + 2 )
    {
      a = double( nn + 2 ) 
        / double( ( nn + 2 ) * ( nn + 2 ) - m * m );

      b = double( 4 * ( nn + 1 ) );

      c = double( ( nn + m ) * ( nn + m ) ) / double( nn ) 
        + double( ( nn - m + 2 ) * ( nn - m + 2 ) ) 
        / double( nn + 2 );

      d = double( nn * nn - m * m ) / double( nn );

      zp2 = a * ( ( b * rho * rho - c ) * z - d * zm2 );
      zm2 = z;
      z = zp2;
    }
  }

  return z;
}